

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ConstantExpression::Deserialize(ConstantExpression *this,Deserializer *deserializer)

{
  tuple<duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_> this_00;
  pointer pCVar1;
  __uniq_ptr_impl<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
  .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
        )operator_new(0x78);
  ConstantExpression((ConstantExpression *)
                     this_00.
                     super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
                     .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
  .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>)
       (tuple<duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
       .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl;
  pCVar1 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::Value>(deserializer,200,"value",&pCVar1->value);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
       .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ConstantExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ConstantExpression>(new ConstantExpression());
	deserializer.ReadProperty<Value>(200, "value", result->value);
	return std::move(result);
}